

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_ghost.cpp
# Opt level: O1

Remotes * Omega_h::push_elem_uses
                    (Remotes *__return_storage_ptr__,RemoteGraph *own_verts2own_elems,
                    Dist *own_verts2verts)

{
  int *piVar1;
  void **ppvVar2;
  ulong uVar3;
  long lVar4;
  Alloc *pAVar5;
  int iVar6;
  void *pvVar7;
  uint uVar8;
  int iVar9;
  LO nrroots;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  LOs own_verts2serv_uses;
  Write<int> vert_idxs;
  Write<int> vert_ranks;
  Write<int> elem_idxs;
  Write<int> elem_ranks;
  LOs own_verts2serv_verts;
  Remotes serv_uses2own_elems;
  Dist verts2own_verts;
  type f;
  LOs own_verts2items;
  Dist items2verts;
  Remotes items2own_elems;
  Remotes items2verts_map;
  Remotes serv_verts2verts;
  Alloc *local_488;
  Write<int> local_470;
  Write<int> local_460;
  Write<int> local_450;
  Write<int> local_440;
  Alloc *local_430;
  void *local_428;
  Alloc *local_420;
  void *local_418;
  Alloc *local_410;
  void *local_408;
  Read<int> *local_400;
  void *local_3f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3f0;
  void *local_3e8;
  void *local_3e0;
  void *local_3d8;
  void *local_3d0;
  undefined1 local_3c8 [32];
  Alloc *local_3a8;
  void *local_3a0;
  Alloc *local_398;
  void *local_390;
  Alloc *local_388;
  void *local_380;
  Alloc *local_378;
  void *local_370;
  Alloc *local_368;
  void *local_360;
  element_type *local_358;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_350;
  element_type *local_348;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_340;
  Alloc *local_338;
  void *local_330;
  Alloc *local_328;
  void *local_320;
  element_type *local_318;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_310;
  Alloc *local_308;
  void *local_300;
  Alloc *local_2f8;
  void *local_2f0;
  Alloc *local_2e8;
  void *local_2e0;
  Alloc *local_2d8;
  void *local_2d0;
  Alloc *local_2c8;
  void *local_2c0;
  Alloc *local_2b8;
  void *local_2b0;
  element_type *local_2a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2a0;
  element_type *local_298;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_290;
  Alloc *local_288;
  void *local_280;
  Alloc *local_278;
  void *local_270;
  Write<int> local_268;
  Write<int> local_258;
  Write<int> local_248;
  Write<int> local_238;
  LOs local_228;
  LOs local_218;
  Read<int> local_208;
  Dist local_1f8;
  Alloc *local_168;
  void *pvStack_160;
  Alloc *local_158;
  void *pvStack_150;
  Remotes local_140;
  Remotes local_120;
  Remotes *local_100;
  ulong local_f8;
  void *local_f0;
  ulong local_e8;
  Read<signed_char> local_e0;
  Read<signed_char> local_d0;
  Remotes local_c0;
  CommPtr local_a0;
  Read<signed_char> local_90;
  Read<signed_char> local_80;
  Remotes local_70;
  Remotes local_50;
  
  local_488 = (own_verts2own_elems->locals2edges).write_.shared_alloc_.alloc;
  if (((ulong)local_488 & 7) == 0 && local_488 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_488 = (Alloc *)(local_488->size * 8 + 1);
    }
    else {
      local_488->use_count = local_488->use_count + 1;
    }
  }
  pvVar7 = (own_verts2own_elems->locals2edges).write_.shared_alloc_.direct_ptr;
  local_420 = (own_verts2own_elems->edges2remotes).ranks.write_.shared_alloc_.alloc;
  if (((ulong)local_420 & 7) == 0 && local_420 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_420 = (Alloc *)(local_420->size * 8 + 1);
    }
    else {
      local_420->use_count = local_420->use_count + 1;
    }
  }
  local_418 = (own_verts2own_elems->edges2remotes).ranks.write_.shared_alloc_.direct_ptr;
  local_410 = (own_verts2own_elems->edges2remotes).idxs.write_.shared_alloc_.alloc;
  if (((ulong)local_410 & 7) == 0 && local_410 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_410 = (Alloc *)(local_410->size * 8 + 1);
    }
    else {
      local_410->use_count = local_410->use_count + 1;
    }
  }
  local_408 = (own_verts2own_elems->edges2remotes).idxs.write_.shared_alloc_.direct_ptr;
  uVar8 = Dist::nroots(own_verts2verts);
  Dist::roots2items(own_verts2verts);
  local_218.write_.shared_alloc_.alloc = local_488;
  if (((ulong)local_488 & 7) == 0 && local_488 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_218.write_.shared_alloc_.alloc = (Alloc *)(local_488->size * 8 + 1);
    }
    else {
      local_488->use_count = local_488->use_count + 1;
    }
  }
  local_228.write_.shared_alloc_.alloc = local_430;
  if (((ulong)local_430 & 7) == 0 && local_430 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_228.write_.shared_alloc_.alloc = (Alloc *)(local_430->size * 8 + 1);
    }
    else {
      local_430->use_count = local_430->use_count + 1;
    }
  }
  local_228.write_.shared_alloc_.direct_ptr = local_428;
  local_218.write_.shared_alloc_.direct_ptr = pvVar7;
  multiply_fans((Omega_h *)&local_208,&local_218,&local_228);
  pAVar5 = local_228.write_.shared_alloc_.alloc;
  if (((ulong)local_228.write_.shared_alloc_.alloc & 7) == 0 &&
      local_228.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_228.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_228.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  pAVar5 = local_218.write_.shared_alloc_.alloc;
  if (((ulong)local_218.write_.shared_alloc_.alloc & 7) == 0 &&
      local_218.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_218.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_218.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  local_400 = &local_208;
  iVar9 = Read<int>::last(local_400);
  Dist::items2dests(&local_50,own_verts2verts);
  pAVar5 = (Alloc *)(local_3c8 + 0x10);
  local_3c8._0_8_ = pAVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"");
  Write<int>::Write(&local_440,iVar9,(string *)local_3c8);
  if ((Alloc *)local_3c8._0_8_ != pAVar5) {
    operator_delete((void *)local_3c8._0_8_,(ulong)(local_3c8._16_8_ + 1));
  }
  local_3c8._0_8_ = pAVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"");
  Write<int>::Write(&local_450,iVar9,(string *)local_3c8);
  if ((Alloc *)local_3c8._0_8_ != pAVar5) {
    operator_delete((void *)local_3c8._0_8_,(ulong)(local_3c8._16_8_ + 1));
  }
  local_3c8._0_8_ = pAVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"");
  Write<int>::Write(&local_460,iVar9,(string *)local_3c8);
  if ((Alloc *)local_3c8._0_8_ != pAVar5) {
    operator_delete((void *)local_3c8._0_8_,(ulong)(local_3c8._16_8_ + 1));
  }
  local_3c8._0_8_ = pAVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"");
  Write<int>::Write(&local_470,iVar9,(string *)local_3c8);
  if ((Alloc *)local_3c8._0_8_ != pAVar5) {
    operator_delete((void *)local_3c8._0_8_,(ulong)(local_3c8._16_8_ + 1));
  }
  local_318 = (element_type *)local_208.write_.shared_alloc_.alloc;
  if (((ulong)local_208.write_.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_208.write_.shared_alloc_.alloc != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_318 = (element_type *)((long)(local_208.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      ppvVar2 = &(((HostRead<int> *)&(local_208.write_.shared_alloc_.alloc)->ptr)->read_).write_.
                 shared_alloc_.direct_ptr;
      *(int *)ppvVar2 = *(int *)ppvVar2 + 1;
    }
  }
  local_310 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_208.write_.shared_alloc_.direct_ptr;
  local_308 = local_430;
  if (((ulong)local_430 & 7) == 0 && local_430 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_308 = (Alloc *)(local_430->size * 8 + 1);
    }
    else {
      local_430->use_count = local_430->use_count + 1;
    }
  }
  local_300 = local_428;
  local_2f8 = local_488;
  if (((ulong)local_488 & 7) == 0 && local_488 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_2f8 = (Alloc *)(local_488->size * 8 + 1);
    }
    else {
      local_488->use_count = local_488->use_count + 1;
    }
  }
  local_2e8 = local_440.shared_alloc_.alloc;
  if (((ulong)local_440.shared_alloc_.alloc & 7) == 0 &&
      local_440.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_2e8 = (Alloc *)((local_440.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_440.shared_alloc_.alloc)->use_count = (local_440.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_2e0 = local_440.shared_alloc_.direct_ptr;
  local_2d8 = local_420;
  if (((ulong)local_420 & 7) == 0 && local_420 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_2d8 = (Alloc *)(local_420->size * 8 + 1);
    }
    else {
      local_420->use_count = local_420->use_count + 1;
    }
  }
  local_2d0 = local_418;
  local_2c8 = local_410;
  if (((ulong)local_410 & 7) == 0 && local_410 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_2c8 = (Alloc *)(local_410->size * 8 + 1);
    }
    else {
      local_410->use_count = local_410->use_count + 1;
    }
  }
  local_2c0 = local_408;
  local_2b8 = local_450.shared_alloc_.alloc;
  if (((ulong)local_450.shared_alloc_.alloc & 7) == 0 &&
      local_450.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_2b8 = (Alloc *)((local_450.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_450.shared_alloc_.alloc)->use_count = (local_450.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_2b0 = local_450.shared_alloc_.direct_ptr;
  local_2a8 = (element_type *)local_460.shared_alloc_.alloc;
  if (((ulong)local_460.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_460.shared_alloc_.alloc != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_2a8 = (element_type *)((long)(local_460.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      ppvVar2 = &(((HostRead<int> *)&(local_460.shared_alloc_.alloc)->ptr)->read_).write_.
                 shared_alloc_.direct_ptr;
      *(int *)ppvVar2 = *(int *)ppvVar2 + 1;
    }
  }
  local_2a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_460.shared_alloc_.direct_ptr;
  local_298 = (element_type *)local_50.ranks.write_.shared_alloc_.alloc;
  if (((ulong)local_50.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_50.ranks.write_.shared_alloc_.alloc != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_298 = (element_type *)((long)(local_50.ranks.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      ppvVar2 = &(((HostRead<int> *)&(local_50.ranks.write_.shared_alloc_.alloc)->ptr)->read_).
                 write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar2 = *(int *)ppvVar2 + 1;
    }
  }
  local_290 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_50.ranks.write_.shared_alloc_.direct_ptr;
  local_288 = local_50.idxs.write_.shared_alloc_.alloc;
  if (((ulong)local_50.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
      local_50.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_288 = (Alloc *)((local_50.idxs.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_50.idxs.write_.shared_alloc_.alloc)->use_count =
           (local_50.idxs.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_280 = local_50.idxs.write_.shared_alloc_.direct_ptr;
  local_278 = local_470.shared_alloc_.alloc;
  if (((ulong)local_470.shared_alloc_.alloc & 7) == 0 &&
      local_470.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_278 = (Alloc *)((local_470.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_470.shared_alloc_.alloc)->use_count = (local_470.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_270 = local_470.shared_alloc_.direct_ptr;
  local_1f8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_318;
  if (((ulong)local_318 & 7) == 0 && local_318 != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_1f8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)((long)local_318->library_ * 8 + 1);
    }
    else {
      ppvVar2 = &(local_318->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar2 = *(int *)ppvVar2 + 1;
    }
  }
  local_1f8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208.write_.shared_alloc_.direct_ptr;
  local_1f8.roots2items_[0].write_.shared_alloc_.alloc = local_308;
  if (((ulong)local_308 & 7) == 0 && local_308 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1f8.roots2items_[0].write_.shared_alloc_.alloc = (Alloc *)(local_308->size * 8 + 1);
    }
    else {
      local_308->use_count = local_308->use_count + 1;
    }
  }
  local_1f8.roots2items_[0].write_.shared_alloc_.direct_ptr = local_428;
  local_1f8.roots2items_[1].write_.shared_alloc_.alloc = local_2f8;
  if (((ulong)local_2f8 & 7) == 0 && local_2f8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1f8.roots2items_[1].write_.shared_alloc_.alloc = (Alloc *)(local_2f8->size * 8 + 1);
    }
    else {
      local_2f8->use_count = local_2f8->use_count + 1;
    }
  }
  local_1f8.items2content_[0].write_.shared_alloc_.alloc = local_2e8;
  if (((ulong)local_2e8 & 7) == 0 && local_2e8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1f8.items2content_[0].write_.shared_alloc_.alloc = (Alloc *)(local_2e8->size * 8 + 1);
    }
    else {
      local_2e8->use_count = local_2e8->use_count + 1;
    }
  }
  local_3d0 = local_440.shared_alloc_.direct_ptr;
  local_1f8.items2content_[0].write_.shared_alloc_.direct_ptr = local_440.shared_alloc_.direct_ptr;
  local_1f8.items2content_[1].write_.shared_alloc_.alloc = local_2d8;
  if (((ulong)local_2d8 & 7) == 0 && local_2d8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1f8.items2content_[1].write_.shared_alloc_.alloc = (Alloc *)(local_2d8->size * 8 + 1);
    }
    else {
      local_2d8->use_count = local_2d8->use_count + 1;
    }
  }
  local_3d8 = local_418;
  local_1f8.items2content_[1].write_.shared_alloc_.direct_ptr = local_418;
  local_1f8.msgs2content_[0].write_.shared_alloc_.alloc = local_2c8;
  if (((ulong)local_2c8 & 7) == 0 && local_2c8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1f8.msgs2content_[0].write_.shared_alloc_.alloc = (Alloc *)(local_2c8->size * 8 + 1);
    }
    else {
      local_2c8->use_count = local_2c8->use_count + 1;
    }
  }
  local_3e0 = local_408;
  local_1f8.msgs2content_[0].write_.shared_alloc_.direct_ptr = local_408;
  local_1f8.msgs2content_[1].write_.shared_alloc_.alloc = local_2b8;
  if (((ulong)local_2b8 & 7) == 0 && local_2b8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1f8.msgs2content_[1].write_.shared_alloc_.alloc = (Alloc *)(local_2b8->size * 8 + 1);
    }
    else {
      local_2b8->use_count = local_2b8->use_count + 1;
    }
  }
  local_3e8 = local_450.shared_alloc_.direct_ptr;
  local_1f8.msgs2content_[1].write_.shared_alloc_.direct_ptr = local_450.shared_alloc_.direct_ptr;
  local_1f8.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_2a8;
  if (((ulong)local_2a8 & 7) == 0 && local_2a8 != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_1f8.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)((long)local_2a8->library_ * 8 + 1);
    }
    else {
      ppvVar2 = &(local_2a8->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar2 = *(int *)ppvVar2 + 1;
    }
  }
  local_3f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_460.shared_alloc_.direct_ptr;
  local_1f8.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_460.shared_alloc_.direct_ptr;
  local_1f8.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_298;
  if (((ulong)local_298 & 7) == 0 && local_298 != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_1f8.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)((long)local_298->library_ * 8 + 1);
    }
    else {
      ppvVar2 = &(local_298->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar2 = *(int *)ppvVar2 + 1;
    }
  }
  local_1f8.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_50.ranks.write_.shared_alloc_.direct_ptr;
  local_168 = local_288;
  if (((ulong)local_288 & 7) == 0 && local_288 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_168 = (Alloc *)(local_288->size * 8 + 1);
    }
    else {
      local_288->use_count = local_288->use_count + 1;
    }
  }
  pvStack_160 = local_50.idxs.write_.shared_alloc_.direct_ptr;
  local_158 = local_278;
  if (((ulong)local_278 & 7) == 0 && local_278 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_158 = (Alloc *)(local_278->size * 8 + 1);
    }
    else {
      local_278->use_count = local_278->use_count + 1;
    }
  }
  local_3f8 = local_470.shared_alloc_.direct_ptr;
  pvStack_150 = local_470.shared_alloc_.direct_ptr;
  local_2f0 = pvVar7;
  local_1f8.roots2items_[1].write_.shared_alloc_.direct_ptr = pvVar7;
  if (0 < (int)uVar8) {
    local_3c8._0_8_ =
         local_1f8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_3c8._8_8_ = local_208.write_.shared_alloc_.direct_ptr;
    if (((ulong)local_1f8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr & 7) == 0 &&
        local_1f8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0) {
      ppvVar2 = &((local_1f8.parent_comm_.
                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->host_srcs_
                 ).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
      local_3c8._0_8_ =
           (long)(local_1f8.parent_comm_.
                  super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->library_ *
           8 + 1;
    }
    local_1f8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_1f8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_3c8._16_8_ = local_1f8.roots2items_[0].write_.shared_alloc_.alloc;
    local_3c8._24_8_ = local_428;
    if (((ulong)local_1f8.roots2items_[0].write_.shared_alloc_.alloc & 7) == 0 &&
        local_1f8.roots2items_[0].write_.shared_alloc_.alloc != (Alloc *)0x0) {
      (local_1f8.roots2items_[0].write_.shared_alloc_.alloc)->use_count =
           (local_1f8.roots2items_[0].write_.shared_alloc_.alloc)->use_count + -1;
      local_3c8._16_8_ = (local_1f8.roots2items_[0].write_.shared_alloc_.alloc)->size * 8 + 1;
    }
    local_1f8.roots2items_[0].write_.shared_alloc_.alloc = (Alloc *)0x0;
    local_1f8.roots2items_[0].write_.shared_alloc_.direct_ptr = (void *)0x0;
    local_3a8 = local_1f8.roots2items_[1].write_.shared_alloc_.alloc;
    if (((ulong)local_1f8.roots2items_[1].write_.shared_alloc_.alloc & 7) == 0 &&
        local_1f8.roots2items_[1].write_.shared_alloc_.alloc != (Alloc *)0x0) {
      (local_1f8.roots2items_[1].write_.shared_alloc_.alloc)->use_count =
           (local_1f8.roots2items_[1].write_.shared_alloc_.alloc)->use_count + -1;
      local_3a8 = (Alloc *)((local_1f8.roots2items_[1].write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_1f8.roots2items_[1].write_.shared_alloc_.alloc = (Alloc *)0x0;
    local_1f8.roots2items_[1].write_.shared_alloc_.direct_ptr = (void *)0x0;
    local_398 = local_1f8.items2content_[0].write_.shared_alloc_.alloc;
    local_390 = local_440.shared_alloc_.direct_ptr;
    if (((ulong)local_1f8.items2content_[0].write_.shared_alloc_.alloc & 7) == 0 &&
        local_1f8.items2content_[0].write_.shared_alloc_.alloc != (Alloc *)0x0) {
      (local_1f8.items2content_[0].write_.shared_alloc_.alloc)->use_count =
           (local_1f8.items2content_[0].write_.shared_alloc_.alloc)->use_count + -1;
      local_398 = (Alloc *)((local_1f8.items2content_[0].write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_1f8.items2content_[0].write_.shared_alloc_.alloc = (Alloc *)0x0;
    local_1f8.items2content_[0].write_.shared_alloc_.direct_ptr = (void *)0x0;
    local_388 = local_1f8.items2content_[1].write_.shared_alloc_.alloc;
    local_380 = local_418;
    if (((ulong)local_1f8.items2content_[1].write_.shared_alloc_.alloc & 7) == 0 &&
        local_1f8.items2content_[1].write_.shared_alloc_.alloc != (Alloc *)0x0) {
      (local_1f8.items2content_[1].write_.shared_alloc_.alloc)->use_count =
           (local_1f8.items2content_[1].write_.shared_alloc_.alloc)->use_count + -1;
      local_388 = (Alloc *)((local_1f8.items2content_[1].write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_1f8.items2content_[1].write_.shared_alloc_.alloc = (Alloc *)0x0;
    local_1f8.items2content_[1].write_.shared_alloc_.direct_ptr = (void *)0x0;
    local_378 = local_1f8.msgs2content_[0].write_.shared_alloc_.alloc;
    local_370 = local_408;
    if (((ulong)local_1f8.msgs2content_[0].write_.shared_alloc_.alloc & 7) == 0 &&
        local_1f8.msgs2content_[0].write_.shared_alloc_.alloc != (Alloc *)0x0) {
      (local_1f8.msgs2content_[0].write_.shared_alloc_.alloc)->use_count =
           (local_1f8.msgs2content_[0].write_.shared_alloc_.alloc)->use_count + -1;
      local_378 = (Alloc *)((local_1f8.msgs2content_[0].write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_1f8.msgs2content_[0].write_.shared_alloc_.alloc = (Alloc *)0x0;
    local_1f8.msgs2content_[0].write_.shared_alloc_.direct_ptr = (void *)0x0;
    local_368 = local_1f8.msgs2content_[1].write_.shared_alloc_.alloc;
    local_360 = local_450.shared_alloc_.direct_ptr;
    if (((ulong)local_1f8.msgs2content_[1].write_.shared_alloc_.alloc & 7) == 0 &&
        local_1f8.msgs2content_[1].write_.shared_alloc_.alloc != (Alloc *)0x0) {
      (local_1f8.msgs2content_[1].write_.shared_alloc_.alloc)->use_count =
           (local_1f8.msgs2content_[1].write_.shared_alloc_.alloc)->use_count + -1;
      local_368 = (Alloc *)((local_1f8.msgs2content_[1].write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_1f8.msgs2content_[1].write_.shared_alloc_.alloc = (Alloc *)0x0;
    local_1f8.msgs2content_[1].write_.shared_alloc_.direct_ptr = (void *)0x0;
    local_358 = local_1f8.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
    local_350._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_460.shared_alloc_.direct_ptr;
    if (((ulong)local_1f8.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr & 7) == 0 &&
        local_1f8.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      ppvVar2 = &((local_1f8.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
      local_358 = (element_type *)
                  ((long)(local_1f8.comm_[0].
                          super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         library_ * 8 + 1);
    }
    local_1f8.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_1f8.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_348 = local_1f8.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
    local_340._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_50.ranks.write_.shared_alloc_.direct_ptr;
    if (((ulong)local_1f8.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr & 7) == 0 &&
        local_1f8.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      ppvVar2 = &((local_1f8.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
      local_348 = (element_type *)
                  ((long)(local_1f8.comm_[1].
                          super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         library_ * 8 + 1);
    }
    local_1f8.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_1f8.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_338 = local_168;
    local_330 = local_50.idxs.write_.shared_alloc_.direct_ptr;
    if (((ulong)local_168 & 7) == 0 && local_168 != (Alloc *)0x0) {
      local_168->use_count = local_168->use_count + -1;
      local_338 = (Alloc *)(local_168->size * 8 + 1);
    }
    local_168 = (Alloc *)0x0;
    pvStack_160 = (void *)0x0;
    local_328 = local_158;
    local_320 = local_470.shared_alloc_.direct_ptr;
    if (((ulong)local_158 & 7) == 0 && local_158 != (Alloc *)0x0) {
      local_158->use_count = local_158->use_count + -1;
      local_328 = (Alloc *)(local_158->size * 8 + 1);
    }
    local_158 = (Alloc *)0x0;
    pvStack_150 = (void *)0x0;
    entering_parallel = '\0';
    local_f8 = (ulong)uVar8;
    local_f0 = local_428;
    uVar3 = 0;
    while (uVar13 = uVar3, local_3a0 = pvVar7, local_100 = __return_storage_ptr__,
          uVar13 != local_f8) {
      iVar9 = *(int *)((long)(_func_int ***)local_208.write_.shared_alloc_.direct_ptr + uVar13 * 4);
      iVar6 = *(int *)((long)local_428 + uVar13 * 4);
      lVar10 = (long)iVar6;
      uVar3 = uVar13 + 1;
      if (iVar6 < *(int *)((long)local_428 + uVar13 * 4 + 4)) {
        do {
          iVar6 = *(int *)((long)pvVar7 + uVar13 * 4);
          lVar12 = (long)iVar6;
          if (iVar6 < *(int *)((long)pvVar7 + uVar3 * 4)) {
            lVar11 = (long)iVar9;
            lVar14 = 0;
            do {
              *(undefined4 *)((long)local_440.shared_alloc_.direct_ptr + lVar14 * 4 + lVar11 * 4) =
                   *(undefined4 *)((long)local_418 + lVar14 * 4 + lVar12 * 4);
              *(undefined4 *)((long)local_450.shared_alloc_.direct_ptr + lVar14 * 4 + lVar11 * 4) =
                   *(undefined4 *)((long)local_408 + lVar14 * 4 + lVar12 * 4);
              *(undefined4 *)
               ((long)(_func_int ***)local_460.shared_alloc_.direct_ptr + lVar14 * 4 + lVar11 * 4) =
                   *(undefined4 *)
                    ((long)(_func_int ***)local_50.ranks.write_.shared_alloc_.direct_ptr +
                    lVar10 * 4);
              *(undefined4 *)((long)local_470.shared_alloc_.direct_ptr + lVar14 * 4 + lVar11 * 4) =
                   *(undefined4 *)((long)local_50.idxs.write_.shared_alloc_.direct_ptr + lVar10 * 4)
              ;
              lVar4 = lVar12 + lVar14;
              lVar14 = lVar14 + 1;
            } while (lVar4 + 1 < (long)*(int *)((long)pvVar7 + uVar3 * 4));
            iVar9 = iVar9 + (int)lVar14;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < *(int *)((long)local_428 + uVar3 * 4));
      }
      local_e8 = uVar13;
      if (iVar9 != *(int *)((long)(_func_int ***)local_208.write_.shared_alloc_.direct_ptr +
                           uVar13 * 4 + 4)) {
        fail("assertion %s failed at %s +%d\n","item == own_verts2items[ov + 1]",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_ghost.cpp"
             ,0x45);
      }
    }
    push_elem_uses(Omega_h::RemoteGraph,Omega_h::Dist)::$_0::~__0((__0 *)local_3c8);
    __return_storage_ptr__ = local_100;
  }
  push_elem_uses(Omega_h::RemoteGraph,Omega_h::Dist)::$_0::~__0((__0 *)&local_1f8);
  Dist::invert((Dist *)local_3c8,own_verts2verts);
  nrroots = Dist::nitems((Dist *)local_3c8);
  local_238.shared_alloc_.alloc = local_460.shared_alloc_.alloc;
  if (((ulong)local_460.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_460.shared_alloc_.alloc != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_238.shared_alloc_.alloc = (Alloc *)((long)(local_460.shared_alloc_.alloc)->size * 8 + 1)
      ;
    }
    else {
      ppvVar2 = &(((HostRead<int> *)&(local_460.shared_alloc_.alloc)->ptr)->read_).write_.
                 shared_alloc_.direct_ptr;
      *(int *)ppvVar2 = *(int *)ppvVar2 + 1;
    }
  }
  local_238.shared_alloc_.direct_ptr = local_460.shared_alloc_.direct_ptr;
  Read<int>::Read(&local_80,&local_238);
  local_248.shared_alloc_.alloc = local_470.shared_alloc_.alloc;
  if (((ulong)local_470.shared_alloc_.alloc & 7) == 0 &&
      local_470.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_248.shared_alloc_.alloc = (Alloc *)((local_470.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_470.shared_alloc_.alloc)->use_count = (local_470.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_248.shared_alloc_.direct_ptr = local_470.shared_alloc_.direct_ptr;
  Read<int>::Read(&local_90,&local_248);
  Remotes::Remotes(&local_70,(Read<int> *)&local_80,(LOs *)&local_90);
  if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
      local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_90.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_90.write_.shared_alloc_.alloc);
      operator_delete(local_90.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar5 = local_248.shared_alloc_.alloc;
  if (((ulong)local_248.shared_alloc_.alloc & 7) == 0 &&
      local_248.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_248.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_248.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
      local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_80.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_80.write_.shared_alloc_.alloc);
      operator_delete(local_80.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar5 = local_238.shared_alloc_.alloc;
  if (((ulong)local_238.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_238.shared_alloc_.alloc != (element_type *)0x0) {
    ppvVar2 = &(((HostRead<int> *)&(local_238.shared_alloc_.alloc)->ptr)->read_).write_.
               shared_alloc_.direct_ptr;
    *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
    if (*(int *)ppvVar2 == 0) {
      Alloc::~Alloc(local_238.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  Dist::parent_comm(own_verts2verts);
  local_120.ranks.write_.shared_alloc_.alloc = local_70.ranks.write_.shared_alloc_.alloc;
  if (((ulong)local_70.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
      local_70.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_120.ranks.write_.shared_alloc_.alloc =
           (Alloc *)((local_70.ranks.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_70.ranks.write_.shared_alloc_.alloc)->use_count =
           (local_70.ranks.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_120.ranks.write_.shared_alloc_.direct_ptr = local_70.ranks.write_.shared_alloc_.direct_ptr;
  local_120.idxs.write_.shared_alloc_.alloc = local_70.idxs.write_.shared_alloc_.alloc;
  if (((ulong)local_70.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
      local_70.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_120.idxs.write_.shared_alloc_.alloc =
           (Alloc *)((local_70.idxs.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_70.idxs.write_.shared_alloc_.alloc)->use_count =
           (local_70.idxs.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_120.idxs.write_.shared_alloc_.direct_ptr = local_70.idxs.write_.shared_alloc_.direct_ptr;
  Dist::Dist(&local_1f8,&local_a0,&local_120,nrroots);
  pAVar5 = local_120.idxs.write_.shared_alloc_.alloc;
  if (((ulong)local_120.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
      local_120.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_120.idxs.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_120.idxs.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  pAVar5 = local_120.ranks.write_.shared_alloc_.alloc;
  if (((ulong)local_120.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
      local_120.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_120.ranks.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_120.ranks.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  if (local_a0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_258.shared_alloc_.alloc = local_440.shared_alloc_.alloc;
  if (((ulong)local_440.shared_alloc_.alloc & 7) == 0 &&
      local_440.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_258.shared_alloc_.alloc = (Alloc *)((local_440.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_440.shared_alloc_.alloc)->use_count = (local_440.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_258.shared_alloc_.direct_ptr = local_440.shared_alloc_.direct_ptr;
  Read<int>::Read(&local_d0,&local_258);
  local_268.shared_alloc_.alloc = local_450.shared_alloc_.alloc;
  if (((ulong)local_450.shared_alloc_.alloc & 7) == 0 &&
      local_450.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_268.shared_alloc_.alloc = (Alloc *)((local_450.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_450.shared_alloc_.alloc)->use_count = (local_450.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_268.shared_alloc_.direct_ptr = local_450.shared_alloc_.direct_ptr;
  Read<int>::Read(&local_e0,&local_268);
  Remotes::Remotes(&local_c0,(Read<int> *)&local_d0,(LOs *)&local_e0);
  if (((ulong)local_e0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_e0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_e0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_e0.write_.shared_alloc_.alloc);
      operator_delete(local_e0.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar5 = local_268.shared_alloc_.alloc;
  if (((ulong)local_268.shared_alloc_.alloc & 7) == 0 &&
      local_268.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_268.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_268.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  if (((ulong)local_d0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_d0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_d0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_d0.write_.shared_alloc_.alloc);
      operator_delete(local_d0.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar5 = local_258.shared_alloc_.alloc;
  if (((ulong)local_258.shared_alloc_.alloc & 7) == 0 &&
      local_258.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_258.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_258.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  local_140.ranks.write_.shared_alloc_.alloc = local_c0.ranks.write_.shared_alloc_.alloc;
  if (((ulong)local_c0.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
      local_c0.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_140.ranks.write_.shared_alloc_.alloc =
           (Alloc *)((local_c0.ranks.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_c0.ranks.write_.shared_alloc_.alloc)->use_count =
           (local_c0.ranks.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_140.ranks.write_.shared_alloc_.direct_ptr = local_c0.ranks.write_.shared_alloc_.direct_ptr;
  local_140.idxs.write_.shared_alloc_.alloc = local_c0.idxs.write_.shared_alloc_.alloc;
  if (((ulong)local_c0.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
      local_c0.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_140.idxs.write_.shared_alloc_.alloc =
           (Alloc *)((local_c0.idxs.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_c0.idxs.write_.shared_alloc_.alloc)->use_count =
           (local_c0.idxs.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_140.idxs.write_.shared_alloc_.direct_ptr = local_c0.idxs.write_.shared_alloc_.direct_ptr;
  Dist::exch(__return_storage_ptr__,&local_1f8,&local_140,1);
  pAVar5 = local_140.idxs.write_.shared_alloc_.alloc;
  if (((ulong)local_140.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
      local_140.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_140.idxs.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_140.idxs.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  pAVar5 = local_140.ranks.write_.shared_alloc_.alloc;
  if (((ulong)local_140.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
      local_140.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_140.ranks.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_140.ranks.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  if (((ulong)local_c0.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
      local_c0.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_c0.idxs.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_c0.idxs.write_.shared_alloc_.alloc);
      operator_delete(local_c0.idxs.write_.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_c0.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
      local_c0.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_c0.ranks.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_c0.ranks.write_.shared_alloc_.alloc);
      operator_delete(local_c0.ranks.write_.shared_alloc_.alloc,0x48);
    }
  }
  Dist::~Dist(&local_1f8);
  if (((ulong)local_70.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
      local_70.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_70.idxs.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_70.idxs.write_.shared_alloc_.alloc);
      operator_delete(local_70.idxs.write_.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_70.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
      local_70.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_70.ranks.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_70.ranks.write_.shared_alloc_.alloc);
      operator_delete(local_70.ranks.write_.shared_alloc_.alloc,0x48);
    }
  }
  Dist::~Dist((Dist *)local_3c8);
  push_elem_uses(Omega_h::RemoteGraph,Omega_h::Dist)::$_0::~__0((__0 *)&local_318);
  if (((ulong)local_470.shared_alloc_.alloc & 7) == 0 &&
      local_470.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_470.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_470.shared_alloc_.alloc);
      operator_delete(local_470.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_460.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_460.shared_alloc_.alloc != (element_type *)0x0) {
    ppvVar2 = &(((HostRead<int> *)&(local_460.shared_alloc_.alloc)->ptr)->read_).write_.
               shared_alloc_.direct_ptr;
    *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
    if (*(int *)ppvVar2 == 0) {
      Alloc::~Alloc(local_460.shared_alloc_.alloc);
      operator_delete(local_460.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_450.shared_alloc_.alloc & 7) == 0 &&
      local_450.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_450.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_450.shared_alloc_.alloc);
      operator_delete(local_450.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_440.shared_alloc_.alloc & 7) == 0 &&
      local_440.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_440.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_440.shared_alloc_.alloc);
      operator_delete(local_440.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_50.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
      local_50.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_50.idxs.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_50.idxs.write_.shared_alloc_.alloc);
      operator_delete(local_50.idxs.write_.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_50.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_50.ranks.write_.shared_alloc_.alloc != (element_type *)0x0) {
    ppvVar2 = &(((HostRead<int> *)&(local_50.ranks.write_.shared_alloc_.alloc)->ptr)->read_).write_.
               shared_alloc_.direct_ptr;
    *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
    if (*(int *)ppvVar2 == 0) {
      Alloc::~Alloc(local_50.ranks.write_.shared_alloc_.alloc);
      operator_delete(local_50.ranks.write_.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_208.write_.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_208.write_.shared_alloc_.alloc != (element_type *)0x0) {
    ppvVar2 = &(((HostRead<int> *)&(local_208.write_.shared_alloc_.alloc)->ptr)->read_).write_.
               shared_alloc_.direct_ptr;
    *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
    if (*(int *)ppvVar2 == 0) {
      Alloc::~Alloc(local_208.write_.shared_alloc_.alloc);
      operator_delete(local_208.write_.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_430 & 7) == 0 && local_430 != (Alloc *)0x0) {
    piVar1 = &local_430->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_430);
      operator_delete(local_430,0x48);
    }
  }
  pAVar5 = local_410;
  if (((ulong)local_410 & 7) == 0 && local_410 != (Alloc *)0x0) {
    piVar1 = &local_410->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_410);
      operator_delete(pAVar5,0x48);
    }
  }
  pAVar5 = local_420;
  if (((ulong)local_420 & 7) == 0 && local_420 != (Alloc *)0x0) {
    piVar1 = &local_420->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_420);
      operator_delete(pAVar5,0x48);
    }
  }
  if (((ulong)local_488 & 7) == 0 && local_488 != (Alloc *)0x0) {
    piVar1 = &local_488->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_488);
      operator_delete(local_488,0x48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Remotes push_elem_uses(RemoteGraph own_verts2own_elems, Dist own_verts2verts) {
  auto own_verts2serv_uses = own_verts2own_elems.locals2edges;
  auto serv_uses2own_elems = own_verts2own_elems.edges2remotes;
  auto nown_verts = own_verts2verts.nroots();
  auto own_verts2serv_verts = own_verts2verts.roots2items();
  auto own_verts2items =
      multiply_fans(own_verts2serv_uses, own_verts2serv_verts);
  auto nitems = own_verts2items.last();
  auto serv_verts2verts = own_verts2verts.items2dests();
  Write<I32> elem_ranks(nitems);
  Write<LO> elem_idxs(nitems);
  Write<I32> vert_ranks(nitems);
  Write<LO> vert_idxs(nitems);
  auto f = OMEGA_H_LAMBDA(LO ov) {
    auto item = own_verts2items[ov];
    for (auto sv = own_verts2serv_verts[ov]; sv < own_verts2serv_verts[ov + 1];
         ++sv) {
      for (auto su = own_verts2serv_uses[ov]; su < own_verts2serv_uses[ov + 1];
           ++su) {
        elem_ranks[item] = serv_uses2own_elems.ranks[su];
        elem_idxs[item] = serv_uses2own_elems.idxs[su];
        vert_ranks[item] = serv_verts2verts.ranks[sv];
        vert_idxs[item] = serv_verts2verts.idxs[sv];
        ++item;
      }
    }
    OMEGA_H_CHECK(item == own_verts2items[ov + 1]);
  };
  parallel_for(nown_verts, f, "push_elem_uses");
  auto verts2own_verts = own_verts2verts.invert();
  auto nverts = verts2own_verts.nitems();
  auto items2verts_map = Remotes(Read<I32>(vert_ranks), LOs(vert_idxs));
  Dist items2verts(own_verts2verts.parent_comm(), items2verts_map, nverts);
  auto items2own_elems = Remotes(Read<I32>(elem_ranks), LOs(elem_idxs));
  return items2verts.exch(items2own_elems, 1);
}